

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v2.cpp
# Opt level: O0

void __thiscall
v2::FigureTests_v2_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test::
TestBody(FigureTests_v2_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test
         *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_88;
  AssertHelper local_68;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  unique_ptr<v2::Figure,_std::default_delete<v2::Figure>_> local_38;
  unique_ptr<v2::Figure,_std::default_delete<v2::Figure>_> figure;
  Figure *square_figure;
  Square square;
  FigureTests_v2_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test
  *this_local;
  
  square_figure = (Figure *)0x0;
  square.super_Figure._vptr_Figure = (_func_int **)0x0;
  v2::Square::Square((Square *)&square_figure);
  figure._M_t.super___uniq_ptr_impl<v2::Figure,_std::default_delete<v2::Figure>_>._M_t.
  super__Tuple_impl<0UL,_v2::Figure_*,_std::default_delete<v2::Figure>_>.
  super__Head_base<0UL,_v2::Figure_*,_false>._M_head_impl =
       (__uniq_ptr_data<v2::Figure,_std::default_delete<v2::Figure>,_true,_true>)
       (__uniq_ptr_data<v2::Figure,_std::default_delete<v2::Figure>,_true,_true>)&square_figure;
  clone<v2::Figure>((v2 *)&local_38,(Figure *)&square_figure);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_58,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_58,
               (AssertionResult *)"(std::is_same<std::unique_ptr<Figure>, decltype(figure)>::value)"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v2.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  std::unique_ptr<v2::Figure,_std::default_delete<v2::Figure>_>::~unique_ptr(&local_38);
  v2::Square::~Square((Square *)&square_figure);
  return;
}

Assistant:

TEST(FigureTests_v2, square_clone_method_called_via_base_class_return_pointer_of_type_Figure)
{
    auto  square = Square{};
    auto& square_figure = static_cast<Figure&>(square);
    auto  figure = clone(square_figure);

    ASSERT_TRUE((std::is_same<std::unique_ptr<Figure>, decltype(figure)>::value));
}